

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O3

bool __thiscall
vkb::PhysicalDevice::enable_features_node_if_present
          (PhysicalDevice *this,GenericFeaturesPNextNode *node)

{
  pointer pGVar1;
  pointer pGVar2;
  bool bVar3;
  undefined8 *puVar4;
  pointer pGVar5;
  pointer pGVar6;
  GenericFeaturesPNextNode *extension;
  pointer pGVar7;
  GenericFeatureChain fill_chain;
  GenericFeatureChain requested_features;
  GenericFeatureChain local_130;
  GenericFeatureChain local_118;
  undefined4 local_100 [2];
  pointer local_f8;
  
  memset(local_100,0,0xf0);
  local_118.nodes.
  super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_118.nodes.
  super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_118.nodes.
  super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<vkb::detail::GenericFeaturesPNextNode,std::allocator<vkb::detail::GenericFeaturesPNextNode>>
  ::_M_realloc_insert<vkb::detail::GenericFeaturesPNextNode_const&>
            ((vector<vkb::detail::GenericFeaturesPNextNode,std::allocator<vkb::detail::GenericFeaturesPNextNode>>
              *)&local_118,(iterator)0x0,node);
  std::
  vector<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
  ::vector(&local_130.nodes,&local_118.nodes);
  pGVar2 = local_130.nodes.
           super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
           ._M_impl.super__Vector_impl_data._M_start;
  memset((local_130.nodes.
          super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
          ._M_impl.super__Vector_impl_data._M_start)->fields,0,0x400);
  pGVar6 = pGVar2;
  if (pGVar2 != local_130.nodes.
                super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    pGVar5 = (pointer)0x0;
    pGVar7 = pGVar2;
    do {
      if (pGVar5 != (pointer)0x0) {
        pGVar5->pNext = pGVar7;
      }
      pGVar1 = pGVar7 + 1;
      pGVar6 = local_130.nodes.
               super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pGVar5 = pGVar7;
      pGVar7 = pGVar1;
    } while (pGVar1 != local_130.nodes.
                       super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_f8 = (pointer)0x0;
  if (pGVar2 != pGVar6) {
    local_f8 = pGVar2;
  }
  local_100[0] = 0x3b9bb078;
  if (this->instance_version < 0x401000) {
    if (this->properties2_ext_enabled != false) {
      puVar4 = (undefined8 *)(detail::vulkan_functions()::v + 0x90);
      goto LAB_00107c29;
    }
  }
  else {
    puVar4 = (undefined8 *)(detail::vulkan_functions()::v + 0x88);
LAB_00107c29:
    (*(code *)*puVar4)(this->physical_device,local_100);
    bVar3 = detail::GenericFeatureChain::match_all(&local_130,&local_118);
    if (bVar3) {
      detail::GenericFeatureChain::combine(&this->extended_features_chain,&local_118);
      bVar3 = true;
      goto LAB_00107c61;
    }
  }
  bVar3 = false;
LAB_00107c61:
  if (local_130.nodes.
      super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_130.nodes.
                    super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_130.nodes.
                          super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_130.nodes.
                          super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_118.nodes.
      super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_118.nodes.
                    super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_118.nodes.
                          super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_118.nodes.
                          super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return bVar3;
}

Assistant:

bool PhysicalDevice::enable_features_node_if_present(detail::GenericFeaturesPNextNode const& node) {
    VkPhysicalDeviceFeatures2 actual_pdf2{};

    detail::GenericFeatureChain requested_features;
    requested_features.nodes.push_back(node);

    detail::GenericFeatureChain fill_chain = requested_features;
    // Zero out supported features
    fill_chain.nodes.front().disable_fields();

    actual_pdf2.sType = VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FEATURES_2;
    fill_chain.chain_up(actual_pdf2);

    bool required_features_supported = false;
    bool instance_is_1_1 = instance_version >= VKB_VK_API_VERSION_1_1;
    if (instance_is_1_1 || properties2_ext_enabled) {
        if (instance_is_1_1) {
            detail::vulkan_functions().fp_vkGetPhysicalDeviceFeatures2(physical_device, &actual_pdf2);
        } else {
            detail::vulkan_functions().fp_vkGetPhysicalDeviceFeatures2KHR(physical_device, &actual_pdf2);
        }
        required_features_supported = fill_chain.match_all(requested_features);
        if (required_features_supported) {
            extended_features_chain.combine(requested_features);
        }
    }
    return required_features_supported;
}